

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PackageExportAllDeclarationSyntax *pPVar1;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  Token *in_stack_00000020;
  Token *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  Token *in_stack_00000050;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
                      in_stack_00000018,in_stack_00000010,in_stack_00000050);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PackageExportAllDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PackageExportAllDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.star1.deepClone(alloc),
        node.doubleColon.deepClone(alloc),
        node.star2.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}